

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_done(connectdata *conn,CURLcode status,_Bool premature)

{
  FTP *pFVar1;
  char *pcVar2;
  char **ppcVar3;
  
  pFVar1 = (conn->data->state).proto.ftp;
  if (pFVar1 == (FTP *)0x0) {
    status = CURLE_OK;
  }
  else {
    if (status == CURLE_OK) {
      status = CURLE_OK;
    }
    else {
      (conn->bits).close = true;
    }
    pcVar2 = (conn->proto).ftpc.entrypath;
    if (pcVar2 != (char *)0x0) {
      (*Curl_cfree)(pcVar2);
      (conn->proto).ftpc.entrypath = (char *)0x0;
    }
    ppcVar3 = (conn->proto).ftpc.dirs;
    if (ppcVar3 != (char **)0x0) {
      (*Curl_cfree)(ppcVar3);
      (conn->proto).ftpc.dirs = (char **)0x0;
    }
    pFVar1->transfer = FTPTRANSFER_BODY;
  }
  return status;
}

Assistant:

static CURLcode pop3_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  struct SessionHandle *data = conn->data;
  struct FTP *pop3 = data->state.proto.pop3;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  CURLcode result = CURLE_OK;

  (void)premature;

  if(!pop3)
    /* When the easy handle is removed from the multi while libcurl is still
     * trying to resolve the host name, it seems that the pop3 struct is not
     * yet initialized, but the removal action calls Curl_done() which calls
     * this function. So we simply return success if no pop3 pointer is set.
     */
    return CURLE_OK;

  if(status) {
    conn->bits.close = TRUE; /* marked for closure */
    result = status;         /* use the already set error code */
  }

  /* Cleanup our do based variables */
  Curl_safefree(pop3c->mailbox);
  Curl_safefree(pop3c->custom);

  /* Clear the transfer mode for the next connection */
  pop3->transfer = FTPTRANSFER_BODY;

  return result;
}